

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::add_n(GB *this)

{
  u8 x;
  GB *this_local;
  
  if ((this->s).op_tick == 0xe) {
    x = read_n(this);
    add(this,x,'\0');
    op_done(this);
  }
  return;
}

Assistant:

void GB::add_n() {
  switch (s.op_tick) {
    case 14: add(read_n()); op_done(); break;
  }
}